

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shape_index.h
# Opt level: O2

CellRelation
S2ShapeIndex::IteratorBase::LocateImpl<MutableS2ShapeIndex::Iterator>(S2CellId target,Iterator *it)

{
  ulong uVar1;
  bool bVar2;
  ulong uVar3;
  
  uVar3 = ~target.id_ & target.id_ - 1;
  MutableS2ShapeIndex::Iterator::Seek(it,(S2CellId)(target.id_ - uVar3));
  uVar1 = (it->super_IteratorBase).id_.id_;
  if (uVar1 != 0xffffffffffffffff) {
    if ((target.id_ <= uVar1) && (uVar1 - (~uVar1 & uVar1 - 1) <= target.id_)) {
      return INDEXED;
    }
    if (uVar1 <= uVar3 + target.id_) {
      return SUBDIVIDED;
    }
  }
  bVar2 = MutableS2ShapeIndex::Iterator::Prev(it);
  if ((bVar2) && (uVar1 = (it->super_IteratorBase).id_.id_, target.id_ <= (uVar1 - 1 | uVar1))) {
    return INDEXED;
  }
  return DISJOINT;
}

Assistant:

inline S2ShapeIndex::CellRelation
S2ShapeIndex::IteratorBase::LocateImpl(S2CellId target, Iter* it) {
  // Let T be the target, let I = cell_map_->lower_bound(T.range_min()), and
  // let I' be the predecessor of I.  If T contains any index cells, then T
  // contains I.  Similarly, if T is contained by an index cell, then the
  // containing cell is either I or I'.  We test for containment by comparing
  // the ranges of leaf cells spanned by T, I, and I'.

  it->Seek(target.range_min());
  if (!it->done()) {
    if (it->id() >= target && it->id().range_min() <= target) return INDEXED;
    if (it->id() <= target.range_max()) return SUBDIVIDED;
  }
  if (it->Prev() && it->id().range_max() >= target) return INDEXED;
  return DISJOINT;
}